

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

void __thiscall
myvk::QueueSelectionResolver::EnumerateDeviceQueueCreateInfos
          (QueueSelectionResolver *this,
          vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
          *out_create_infos,vector<float,_std::allocator<float>_> *out_priorities)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
  *in_RDI;
  VkDeviceQueueCreateInfo info;
  pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>
  *i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
  *__range1_1;
  pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>
  *i;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
  *__range1;
  uint32_t max_queue_count;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff74;
  value_type *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar5;
  value_type_conflict3 *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  _Self in_stack_ffffffffffffffa0;
  _Self local_58;
  _Base_ptr *local_50;
  undefined4 local_44;
  reference local_40;
  _Self local_38;
  _Self local_30;
  _Base_ptr *local_28;
  uint local_1c;
  
  std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::clear
            ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *)0x2b49b8);
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x2b49c5);
  bVar1 = std::
          map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
          ::empty((map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
                   *)0x2b49d2);
  if (!bVar1) {
    local_1c = 0;
    local_28 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
         ::begin(in_RDI);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
         ::end(in_RDI);
    while (bVar1 = std::operator==(&local_30,&local_38), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_40 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
                              *)0x2b4a31);
      sVar2 = std::
              vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>
              ::size(&local_40->second);
      if (local_1c < sVar2) {
        sVar2 = std::
                vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>
                ::size(&local_40->second);
        local_1c = (uint)sVar2;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    local_44 = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffffa0._M_node,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    local_50 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
         ::begin(in_RDI);
    std::
    map<unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
    ::end(in_RDI);
    while (bVar1 = std::operator==(&local_58,(_Self *)&stack0xffffffffffffffa0),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
                            *)0x2b4adf);
      memset(&stack0xffffffffffffff70,0,0x28);
      uVar4 = 2;
      uVar5 = ppVar3->first;
      std::
      vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>
      ::size(&ppVar3->second);
      std::vector<float,_std::allocator<float>_>::data
                ((vector<float,_std::allocator<float>_> *)0x2b4b27);
      std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::push_back
                ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *)
                 CONCAT44(uVar5,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff74,uVar4));
    }
  }
  return;
}

Assistant:

void QueueSelectionResolver::EnumerateDeviceQueueCreateInfos(std::vector<VkDeviceQueueCreateInfo> *out_create_infos,
                                                             std::vector<float> *out_priorities) const {
	out_create_infos->clear();
	out_priorities->clear();

	if (m_queue_creations.empty())
		return;

	uint32_t max_queue_count = 0;
	for (const auto &i : m_queue_creations) {
		if (i.second.size() > max_queue_count)
			max_queue_count = i.second.size();
	}
	out_priorities->resize(max_queue_count, 1.0f);

	for (const auto &i : m_queue_creations) {
		VkDeviceQueueCreateInfo info = {};
		info.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
		info.queueFamilyIndex = i.first;
		info.queueCount = i.second.size();
		info.pQueuePriorities = out_priorities->data();
		out_create_infos->push_back(info);
	}
}